

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc.cpp
# Opt level: O2

bool myutils::make_abs_dir(string *abs_path)

{
  int iVar1;
  bool bVar2;
  string cmd;
  stat s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  stat local_a0;
  
  iVar1 = stat((abs_path->_M_dataplus)._M_p,&local_a0);
  if (iVar1 == 0) {
    bVar2 = true;
  }
  else {
    std::__cxx11::string::string((string *)&local_c0,(string *)abs_path);
    std::operator+(&local_e0,"mkdir -p ",&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    iVar1 = system(local_e0._M_dataplus._M_p);
    bVar2 = iVar1 == 0;
    std::__cxx11::string::~string((string *)&local_e0);
  }
  return bVar2;
}

Assistant:

bool make_abs_dir(const std::string& abs_path)
    {
#ifdef _WIN32
        // if (!fs::exists(abs_path)) {
        //     return fs::create_directories(abs_path);
        // }
        // else {
        //     return true;
        // }
        DWORD attribs = ::GetFileAttributesA(abs_path.c_str());
        if (attribs == INVALID_FILE_ATTRIBUTES) {
            return CreateDirectoryA (abs_path.c_str(), NULL);
        }
        else {
            return (attribs & FILE_ATTRIBUTE_DIRECTORY);
        }
#else
        struct stat s;
        if (stat(abs_path.c_str(), &s) != 0) {
            std::string cmd = "mkdir -p " + string(abs_path);
            return system(cmd.c_str()) == 0;
        }
        else {
            return true;
        }
#endif
    }